

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Filters.cpp
# Opt level: O2

void __thiscall
helics::CloningFilter::setString(CloningFilter *this,string_view property,string_view val)

{
  element_type *peVar1;
  bool bVar2;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_00;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_01;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_02;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_03;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_04;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_05;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_06;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_07;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_08;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_09;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_10;
  
  __y._M_str = "source";
  __y._M_len = 6;
  bVar2 = std::operator==(property,__y);
  if ((bVar2) ||
     (__y_00._M_str = "add source", __y_00._M_len = 10, bVar2 = std::operator==(property,__y_00),
     bVar2)) {
    Interface::addSourceTarget((Interface *)this,val,UNKNOWN);
    return;
  }
  __y_01._M_str = "dest";
  __y_01._M_len = 4;
  bVar2 = std::operator==(property,__y_01);
  if ((((!bVar2) &&
       (__y_02._M_str = "destination", __y_02._M_len = 0xb, bVar2 = std::operator==(property,__y_02)
       , !bVar2)) &&
      (__y_03._M_str = "add destination", __y_03._M_len = 0xf,
      bVar2 = std::operator==(property,__y_03), !bVar2)) &&
     (__y_04._M_str = "add dest", __y_04._M_len = 8, bVar2 = std::operator==(property,__y_04),
     !bVar2)) {
    __y_05._M_str = "endpoint";
    __y_05._M_len = 8;
    bVar2 = std::operator==(property,__y_05);
    if ((!bVar2) &&
       (__y_06._M_str = "add endpoint", __y_06._M_len = 0xc,
       bVar2 = std::operator==(property,__y_06), !bVar2)) {
      __y_07._M_str = "remove destination";
      __y_07._M_len = 0x12;
      bVar2 = std::operator==(property,__y_07);
      if (((!bVar2) &&
          ((__y_08._M_str = "remove dest", __y_08._M_len = 0xb,
           bVar2 = std::operator==(property,__y_08), !bVar2 &&
           (__y_09._M_str = "remove source", __y_09._M_len = 0xd,
           bVar2 = std::operator==(property,__y_09), !bVar2)))) &&
         (__y_10._M_str = "remove endpoint", __y_10._M_len = 0xf,
         bVar2 = std::operator==(property,__y_10), !bVar2)) {
        peVar1 = (this->super_Filter).filtOp.
                 super___shared_ptr<helics::FilterOperations,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        if (peVar1 == (element_type *)0x0) {
          return;
        }
        (*peVar1->_vptr_FilterOperations[3])
                  (peVar1,property._M_len,property._M_str,val._M_len,val._M_str);
        return;
      }
      Interface::removeTarget((Interface *)this,val);
      return;
    }
    Interface::addSourceTarget((Interface *)this,val,UNKNOWN);
  }
  Interface::addDestinationTarget((Interface *)this,val,UNKNOWN);
  return;
}

Assistant:

void CloningFilter::setString(std::string_view property, std::string_view val)
{
    if ((property == "source") || (property == "add source")) {
        addSourceTarget(val);
    } else if (property == "dest" || property == "destination" || property == "add destination" ||
               property == "add dest") {
        addDestinationTarget(val);
    } else if (property == "endpoint" || property == "add endpoint") {
        addSourceTarget(val);
        addDestinationTarget(val);
    } else if (property == "remove destination" || property == "remove dest" ||
               property == "remove source" || property == "remove endpoint") {
        removeTarget(val);
    } else {
        Filter::setString(property, val);
    }
}